

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QTabBarPrivate::Tab_*>::begin(QList<QTabBarPrivate::Tab_*> *this)

{
  Tab **n;
  QArrayDataPointer<QTabBarPrivate::Tab_*> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QTabBarPrivate::Tab_*> *)0x6baff9);
  QArrayDataPointer<QTabBarPrivate::Tab_*>::operator->(in_RDI);
  n = QArrayDataPointer<QTabBarPrivate::Tab_*>::begin
                ((QArrayDataPointer<QTabBarPrivate::Tab_*> *)0x6bb00a);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }